

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall
Simulator::saveData(Simulator *this,ofstream *state_data,ofstream *control_input_data,
                   ofstream *error_data,double time_param,VectorXd *state_vec,
                   VectorXd *control_input_vec,double optimality_error)

{
  int iVar1;
  int iVar2;
  CoeffReturnType pdVar3;
  ostream *poVar4;
  void *in_RCX;
  ostream *in_RDX;
  ostream *in_RSI;
  long in_RDI;
  double in_XMM1_Qa;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ostream *in_stack_ffffffffffffffa0;
  int local_48;
  int local_44;
  
  local_44 = 0;
  while( true ) {
    iVar1 = NMPCModel::dimState((NMPCModel *)(in_RDI + 8));
    if (iVar1 <= local_44) break;
    in_stack_ffffffffffffffa0 = in_RSI;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_RSI,
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffffa0,*pdVar3);
    std::operator<<(poVar4," ");
    local_44 = local_44 + 1;
  }
  std::operator<<(in_RSI,"\n");
  local_48 = 0;
  while( true ) {
    iVar1 = local_48;
    iVar2 = NMPCModel::dimControlInput((NMPCModel *)(in_RDI + 8));
    if (iVar2 <= iVar1) break;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        in_stack_ffffffffffffffa0,CONCAT44(iVar1,in_stack_ffffffffffffff98));
    poVar4 = (ostream *)std::ostream::operator<<(in_RDX,*pdVar3);
    std::operator<<(poVar4," ");
    local_48 = local_48 + 1;
  }
  std::operator<<(in_RDX,"\n");
  poVar4 = (ostream *)std::ostream::operator<<(in_RCX,in_XMM1_Qa);
  std::operator<<(poVar4,"\n");
  return;
}

Assistant:

void Simulator::saveData(std::ofstream& state_data, std::ofstream& control_input_data, std::ofstream& error_data, const double time_param, const Eigen::VectorXd& state_vec, const Eigen::VectorXd& control_input_vec, const double optimality_error)
{
    for(int i=0; i<model_.dimState(); i++){
        state_data << state_vec(i) << " ";
    }
    state_data << "\n";

    for(int i=0; i<model_.dimControlInput(); i++){
        control_input_data << control_input_vec(i) << " ";
    }
    control_input_data << "\n";

    error_data << optimality_error << "\n";
}